

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::php::anon_unknown_0::PhpGeneratorTest_Basic_Test::TestBody
          (PhpGeneratorTest_Basic_Test *this)

{
  string_view local_40;
  string_view local_30;
  string_view local_20;
  PhpGeneratorTest_Basic_Test *local_10;
  PhpGeneratorTest_Basic_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "\n    syntax = \"proto3\";\n    message Foo {\n      optional int32 bar = 1;\n      int32 baz = 2;\n    }"
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto");
  CommandLineInterfaceTester::RunProtoc((CommandLineInterfaceTester *)this,local_40);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  return;
}

Assistant:

TEST_F(PhpGeneratorTest, Basic) {
  CreateTempFile("foo.proto",
                 R"schema(
    syntax = "proto3";
    message Foo {
      optional int32 bar = 1;
      int32 baz = 2;
    })schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto");

  ExpectNoErrors();
}